

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BitvecBuiltinTest(int sz,int *aOp)

{
  long lVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Bitvec *p;
  void *pvVar6;
  void *pBuf;
  long lVar7;
  long in_RSI;
  int in_EDI;
  long in_FS_OFFSET;
  void *pTmpSpace;
  int op;
  int pc;
  int nx;
  int rc;
  uchar *pV;
  Bitvec *pBitvec;
  int i;
  undefined4 in_stack_ffffffffffffffa8;
  u32 in_stack_ffffffffffffffac;
  int in_stack_ffffffffffffffb0;
  u32 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 uVar8;
  u32 uVar9;
  undefined4 uVar10;
  int iVar11;
  uint uVar12;
  uint local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar12 = -1;
  uVar10 = 0xaaaaaaaa;
  uVar9 = 0xaaaaaaaa;
  uVar8 = 0xaaaaaaaa;
  p = sqlite3BitvecCreate(in_stack_ffffffffffffffb4);
  pvVar6 = sqlite3MallocZero(CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  pBuf = sqlite3_malloc64(CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  if (((p != (Bitvec *)0x0) && (pvVar6 != (void *)0x0)) && (pBuf != (void *)0x0)) {
    sqlite3BitvecSet((Bitvec *)CONCAT44(uVar9,uVar8),(u32)((ulong)pBuf >> 0x20));
    sqlite3BitvecClear((Bitvec *)CONCAT44(uVar12,uVar10),uVar9,pBuf);
    local_c = 0;
    uVar9 = 0;
    do {
      while( true ) {
        uVar4 = *(uint *)(in_RSI + (long)(int)uVar9 * 4);
        if (uVar4 == 0) {
          in_stack_ffffffffffffffb0 =
               sqlite3BitvecTest((Bitvec *)
                                 CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                                 in_stack_ffffffffffffffac);
          iVar11 = sqlite3BitvecTest((Bitvec *)
                                     CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                                     in_stack_ffffffffffffffac);
          in_stack_ffffffffffffffb4 = in_stack_ffffffffffffffb0 + iVar11;
          iVar11 = sqlite3BitvecTest((Bitvec *)
                                     CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                                     in_stack_ffffffffffffffac);
          iVar11 = in_stack_ffffffffffffffb4 + iVar11;
          uVar9 = sqlite3BitvecSize(p);
          iVar11 = iVar11 + (uVar9 - in_EDI);
          local_c = 1;
          goto LAB_00150b96;
        }
        if ((uVar4 - 1 < 2) || ((1 < uVar4 - 3 && (uVar4 == 5)))) {
          iVar11 = 4;
          local_c = *(int *)(in_RSI + (long)(int)(uVar9 + 2) * 4) - 1;
          *(int *)(in_RSI + (long)(int)(uVar9 + 2) * 4) =
               *(int *)(in_RSI + (long)(int)(uVar9 + 3) * 4) +
               *(int *)(in_RSI + (long)(int)(uVar9 + 2) * 4);
        }
        else {
          iVar11 = 2;
          sqlite3_randomness((int)((ulong)pBuf >> 0x20),
                             (void *)CONCAT44(uVar4,in_stack_ffffffffffffffb8));
        }
        iVar3 = *(int *)(in_RSI + (long)(int)(uVar9 + 1) * 4) + -1;
        *(int *)(in_RSI + (long)(int)(uVar9 + 1) * 4) = iVar3;
        if (0 < iVar3) {
          iVar11 = 0;
        }
        uVar9 = iVar11 + uVar9;
        lVar7 = (long)(ulong)(local_c & 0x7fffffff) % (long)in_EDI;
        local_c = (uint)lVar7;
        cVar2 = (char)lVar7;
        if ((uVar4 & 1) != 0) break;
        lVar7 = (long)((int)(local_c + 1) >> 3);
        *(byte *)((long)pvVar6 + lVar7) =
             *(byte *)((long)pvVar6 + lVar7) & ((byte)(1 << (cVar2 + 1U & 7)) ^ 0xff);
        sqlite3BitvecClear((Bitvec *)CONCAT44(uVar12,iVar11),uVar9,pBuf);
      }
      lVar7 = (long)((int)(local_c + 1) >> 3);
      *(byte *)((long)pvVar6 + lVar7) =
           *(byte *)((long)pvVar6 + lVar7) | (byte)(1 << (cVar2 + 1U & 7));
    } while ((uVar4 == 5) ||
            (iVar11 = sqlite3BitvecSet((Bitvec *)CONCAT44(uVar9,uVar4),(u32)((ulong)pBuf >> 0x20)),
            iVar11 == 0));
  }
LAB_00150c07:
  sqlite3_free((void *)0x150c11);
  sqlite3_free((void *)0x150c1b);
  sqlite3BitvecDestroy((Bitvec *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return uVar12;
LAB_00150b96:
  uVar12 = iVar11;
  if (in_EDI < (int)local_c) goto LAB_00150c07;
  uVar4 = (uint)(((uint)*(byte *)((long)pvVar6 + (long)((int)local_c >> 3)) &
                 1 << ((byte)local_c & 7)) != 0);
  uVar5 = sqlite3BitvecTest((Bitvec *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                            uVar4);
  uVar12 = local_c;
  if (uVar4 != uVar5) goto LAB_00150c07;
  local_c = local_c + 1;
  goto LAB_00150b96;
}

Assistant:

SQLITE_PRIVATE int sqlite3BitvecBuiltinTest(int sz, int *aOp){
  Bitvec *pBitvec = 0;
  unsigned char *pV = 0;
  int rc = -1;
  int i, nx, pc, op;
  void *pTmpSpace;

  /* Allocate the Bitvec to be tested and a linear array of
  ** bits to act as the reference */
  pBitvec = sqlite3BitvecCreate( sz );
  pV = sqlite3MallocZero( (sz+7)/8 + 1 );
  pTmpSpace = sqlite3_malloc64(BITVEC_SZ);
  if( pBitvec==0 || pV==0 || pTmpSpace==0  ) goto bitvec_end;

  /* NULL pBitvec tests */
  sqlite3BitvecSet(0, 1);
  sqlite3BitvecClear(0, 1, pTmpSpace);

  /* Run the program */
  pc = i = 0;
  while( (op = aOp[pc])!=0 ){
    switch( op ){
      case 1:
      case 2:
      case 5: {
        nx = 4;
        i = aOp[pc+2] - 1;
        aOp[pc+2] += aOp[pc+3];
        break;
      }
      case 3:
      case 4:
      default: {
        nx = 2;
        sqlite3_randomness(sizeof(i), &i);
        break;
      }
    }
    if( (--aOp[pc+1]) > 0 ) nx = 0;
    pc += nx;
    i = (i & 0x7fffffff)%sz;
    if( (op & 1)!=0 ){
      SETBIT(pV, (i+1));
      if( op!=5 ){
        if( sqlite3BitvecSet(pBitvec, i+1) ) goto bitvec_end;
      }
    }else{
      CLEARBIT(pV, (i+1));
      sqlite3BitvecClear(pBitvec, i+1, pTmpSpace);
    }
  }

  /* Test to make sure the linear array exactly matches the
  ** Bitvec object.  Start with the assumption that they do
  ** match (rc==0).  Change rc to non-zero if a discrepancy
  ** is found.
  */
  rc = sqlite3BitvecTest(0,0) + sqlite3BitvecTest(pBitvec, sz+1)
          + sqlite3BitvecTest(pBitvec, 0)
          + (sqlite3BitvecSize(pBitvec) - sz);
  for(i=1; i<=sz; i++){
    if(  (TESTBIT(pV,i))!=sqlite3BitvecTest(pBitvec,i) ){
      rc = i;
      break;
    }
  }

  /* Free allocated structure */
bitvec_end:
  sqlite3_free(pTmpSpace);
  sqlite3_free(pV);
  sqlite3BitvecDestroy(pBitvec);
  return rc;
}